

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x86MOVD(uchar *stream,x86Reg dst,x86XmmReg src)

{
  byte bVar1;
  bool bVar2;
  
  *stream = 'f';
  bVar1 = 8 < (int)dst | (7 < (int)src) << 2;
  bVar2 = bVar1 != 0;
  if (bVar2) {
    stream[1] = bVar1 | 0x40;
  }
  (stream + (ulong)bVar2 + 1)[0] = '\x0f';
  (stream + (ulong)bVar2 + 1)[1] = '~';
  stream[(ulong)bVar2 + 3] = (char)src << 3 | regCode[dst] | 0xc0;
  return (((int)(stream + 1) + (uint)bVar2) - (int)stream) + 3;
}

Assistant:

int x86MOVD(unsigned char *stream, x86Reg dst, x86XmmReg src)
{
	unsigned char *start = stream;

	*stream++ = 0x66;
	stream += encodeRex(stream, false, src, dst);
	*stream++ = 0x0f;
	*stream++ = 0x7e;
	*stream++ = encodeRegister(dst, src);

	return int(stream - start);
}